

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v6::detail::
int_writer<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char,_unsigned___int128>::
on_hex(int_writer<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char,_unsigned___int128>
       *this)

{
  char cVar1;
  uint uVar2;
  basic_format_specs<char> *specs;
  size_t sVar3;
  ulong uVar4;
  ulong uVar5;
  char *pcVar6;
  char *digits;
  ulong uVar7;
  ptrdiff_t _Num;
  char *pcVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  char *pcVar12;
  bool bVar13;
  bool bVar14;
  string_view prefix;
  write_int_data<char> data;
  char *in_stack_ffffffffffffff88;
  char *in_stack_ffffffffffffff90;
  buffer<char> *pbVar15;
  write_int_data<char> local_40;
  
  specs = this->specs;
  if ((char)specs->field_0x9 < '\0') {
    uVar2 = this->prefix_size;
    this->prefix_size = uVar2 + 1;
    this->prefix[uVar2] = '0';
    cVar1 = specs->type;
    uVar2 = this->prefix_size;
    this->prefix_size = uVar2 + 1;
    this->prefix[uVar2] = cVar1;
  }
  lVar9 = 0;
  uVar5 = (ulong)this->abs_value;
  uVar7 = *(ulong *)((long)&this->abs_value + 8);
  do {
    lVar9 = lVar9 + 1;
    bVar13 = 0xf < uVar5;
    bVar14 = uVar7 != 0;
    uVar10 = -uVar7;
    uVar5 = uVar7 << 0x3c | uVar5 >> 4;
    uVar7 = uVar7 >> 4;
  } while (bVar14 || uVar10 < bVar13);
  pbVar15 = (this->out).container;
  uVar7 = (ulong)this->prefix_size;
  prefix.size_._0_4_ = this->prefix_size;
  prefix.data_ = this->prefix;
  prefix.size_._4_4_ = 0;
  write_int_data<char>::write_int_data(&local_40,(int)lVar9,prefix,specs);
  uVar5 = (ulong)specs->width;
  if (-1 < (long)uVar5) {
    uVar10 = 0;
    if (local_40.size <= uVar5) {
      uVar10 = uVar5 - local_40.size;
    }
    uVar5 = uVar10 >> (*(byte *)((long)&basic_data<void>::right_padding_shifts +
                                (ulong)((byte)specs->field_0x9 & 0xf)) & 0x3f);
    sVar3 = pbVar15->size_;
    uVar11 = local_40.size + sVar3 + (specs->fill).size_ * uVar10;
    if (pbVar15->capacity_ < uVar11) {
      (**pbVar15->_vptr_buffer)(pbVar15,uVar11);
    }
    pbVar15->size_ = uVar11;
    pcVar6 = fill<char*,char>(pbVar15->ptr_ + sVar3,uVar5,&specs->fill);
    if (uVar7 != 0) {
      memmove(pcVar6,this->prefix,uVar7);
      pcVar6 = pcVar6 + uVar7;
    }
    pcVar12 = pcVar6;
    if (local_40.padding != 0) {
      pcVar12 = pcVar6 + local_40.padding;
      memset(pcVar6,0x30,local_40.padding);
    }
    pcVar6 = "0123456789ABCDEF";
    if (this->specs->type == 'x') {
      pcVar6 = "0123456789abcdef";
    }
    pcVar8 = pcVar12 + lVar9;
    uVar7 = (ulong)this->abs_value;
    uVar11 = *(ulong *)((long)&this->abs_value + 8);
    do {
      pcVar8 = pcVar8 + -1;
      *pcVar8 = pcVar6[(uint)uVar7 & 0xf];
      bVar13 = 0xf < uVar7;
      bVar14 = uVar11 != 0;
      uVar4 = -uVar11;
      uVar7 = uVar11 << 0x3c | uVar7 >> 4;
      uVar11 = uVar11 >> 4;
    } while (bVar14 || uVar4 < bVar13);
    fill<char*,char>(pcVar12 + lVar9,uVar10 - uVar5,&specs->fill);
    (this->out).container = pbVar15;
    return;
  }
  assert_fail(in_stack_ffffffffffffff90,0,in_stack_ffffffffffffff88);
}

Assistant:

void on_hex() {
    if (specs.alt) {
      prefix[prefix_size++] = '0';
      prefix[prefix_size++] = specs.type;
    }
    int num_digits = count_digits<4>(abs_value);
    out = write_int(out, num_digits, get_prefix(), specs,
                    [this, num_digits](iterator it) {
                      return format_uint<4, Char>(it, abs_value, num_digits,
                                                  specs.type != 'x');
                    });
  }